

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder_suite.cpp
# Opt level: O3

int main(void)

{
  int iVar1;
  
  basic_suite::run();
  small_suite::run();
  int8_suite::run();
  int16_suite::run();
  int32_suite::run();
  int64_suite::run();
  float32_suite::run();
  float64_suite::run();
  string_suite::test_string8_empty();
  string_suite::test_string8_abcde();
  string_suite::test_string16();
  container_suite::run();
  compact_int8_suite::test_empty();
  compact_int8_suite::test_one();
  compact_int8_suite::test_two();
  compact_int16_suite::test_empty();
  compact_int16_suite::test_one();
  compact_int16_suite::test_two();
  compact_int32_suite::test_empty();
  compact_int32_suite::test_one();
  compact_int32_suite::test_two();
  compact_int64_suite::test_empty();
  compact_int64_suite::test_one();
  compact_int64_suite::test_two();
  compact_float32_suite::test_empty();
  compact_float32_suite::test_one();
  compact_float32_suite::test_two();
  compact_float64_suite::test_empty();
  compact_float64_suite::test_one();
  compact_float64_suite::test_two();
  iVar1 = boost::report_errors();
  return iVar1;
}

Assistant:

int main()
{
    basic_suite::run();
    small_suite::run();
    int8_suite::run();
    int16_suite::run();
    int32_suite::run();
    int64_suite::run();
    float32_suite::run();
    float64_suite::run();
    string_suite::run();
    container_suite::run();
    compact_int8_suite::run();
    compact_int16_suite::run();
    compact_int32_suite::run();
    compact_int64_suite::run();
    compact_float32_suite::run();
    compact_float64_suite::run();

    return boost::report_errors();
}